

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O3

u32 __thiscall
irr::scene::CSceneManager::registerNodeForRendering
          (CSceneManager *this,ISceneNode *node,E_SCENE_NODE_RENDER_PASS pass)

{
  pointer *ppDVar1;
  pointer *ppTVar2;
  IVideoDriver *pIVar3;
  iterator __position;
  pointer ppIVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar7;
  array<irr::scene::ISceneNode_*> *this_00;
  iterator iVar8;
  uint uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  TransparentNodeEntry e;
  TransparentNodeEntry local_40;
  ISceneNode *local_30;
  
  local_40.Node = node;
  local_30 = node;
  if ((int)pass < 0x10) {
    if (pass == ESNRP_CAMERA) {
      ppIVar4 = (this->CameraList).m_data.
                super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar5 = (int)((ulong)((long)(this->CameraList).m_data.
                                  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar4) >> 3);
      if (iVar5 != 0) {
        lVar7 = 0;
        do {
          if (ppIVar4[lVar7] == node) {
            return 0;
          }
          lVar7 = lVar7 + 1;
        } while (iVar5 != (int)lVar7);
      }
      this_00 = &this->CameraList;
    }
    else {
      if (pass != ESNRP_SKY_BOX) {
        if (pass != ESNRP_SOLID) {
          return 0;
        }
        iVar5 = (*(this->super_ISceneManager)._vptr_ISceneManager[0x23])(this,node);
        if ((char)iVar5 != '\0') {
          return 0;
        }
        goto LAB_001c4a48;
      }
      this_00 = &this->SkyBoxList;
    }
  }
  else {
    if ((int)pass < 0x20) {
      if (pass == ESNRP_TRANSPARENT) {
        iVar5 = (*(this->super_ISceneManager)._vptr_ISceneManager[0x23])(this,node);
        if ((char)iVar5 != '\0') {
          return 0;
        }
        iVar5 = (*node->_vptr_ISceneNode[10])(node);
        lVar7 = CONCAT44(extraout_var_01,iVar5);
        fVar13 = *(float *)(lVar7 + 0x30) - (this->camWorldPos).X;
        fVar11 = *(float *)(lVar7 + 0x34) - (this->camWorldPos).Y;
        fVar12 = *(float *)(lVar7 + 0x38) - (this->camWorldPos).Z;
        local_40.Distance = (f64)(double)(fVar12 * fVar12 + fVar13 * fVar13 + fVar11 * fVar11);
        iVar8._M_current =
             (this->TransparentNodeList).m_data.
             super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (this->TransparentNodeList).m_data.
            super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
          ::_M_realloc_insert<irr::scene::CSceneManager::TransparentNodeEntry>
                    (&(this->TransparentNodeList).m_data,iVar8,&local_40);
        }
        else {
LAB_001c4d0c:
          (iVar8._M_current)->Node = local_40.Node;
          (iVar8._M_current)->Distance = local_40.Distance;
          ppTVar2 = &(this->TransparentNodeList).m_data.
                     super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppTVar2 = *ppTVar2 + 1;
        }
LAB_001c4d1c:
        (this->TransparentNodeList).is_sorted = false;
        return 1;
      }
      if (pass != ESNRP_AUTOMATIC) {
        return 0;
      }
      iVar5 = (*(this->super_ISceneManager)._vptr_ISceneManager[0x23])(this,node);
      if ((char)iVar5 != '\0') {
        return 0;
      }
      uVar6 = (*node->_vptr_ISceneNode[0x16])(node);
      if (uVar6 != 0) {
        uVar10 = 0;
        do {
          pIVar3 = this->Driver;
          iVar5 = (*node->_vptr_ISceneNode[0x15])(node,uVar10);
          iVar5 = (*pIVar3->_vptr_IVideoDriver[0x67])(pIVar3,CONCAT44(extraout_var,iVar5));
          if ((char)iVar5 != '\0') {
            iVar5 = (*node->_vptr_ISceneNode[10])(node);
            lVar7 = CONCAT44(extraout_var_03,iVar5);
            fVar13 = *(float *)(lVar7 + 0x30) - (this->camWorldPos).X;
            fVar11 = *(float *)(lVar7 + 0x34) - (this->camWorldPos).Y;
            fVar12 = *(float *)(lVar7 + 0x38) - (this->camWorldPos).Z;
            local_40.Distance = (f64)(double)(fVar12 * fVar12 + fVar13 * fVar13 + fVar11 * fVar11);
            iVar8._M_current =
                 (this->TransparentNodeList).m_data.
                 super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar8._M_current !=
                (this->TransparentNodeList).m_data.
                super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_001c4d0c;
            ::std::
            vector<irr::scene::CSceneManager::TransparentNodeEntry,std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>>
            ::_M_realloc_insert<irr::scene::CSceneManager::TransparentNodeEntry_const&>
                      ((vector<irr::scene::CSceneManager::TransparentNodeEntry,std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>>
                        *)&this->TransparentNodeList,iVar8,&local_40);
            goto LAB_001c4d1c;
          }
          uVar9 = (int)uVar10 + 1;
          uVar10 = (ulong)uVar9;
        } while (uVar6 != uVar9);
      }
LAB_001c4a48:
      local_40.Distance = 0.0;
      iVar5 = (*node->_vptr_ISceneNode[0x16])(node);
      if (iVar5 != 0) {
        iVar5 = (*node->_vptr_ISceneNode[0x15])(node,0);
        local_40.Distance = *(f64 *)CONCAT44(extraout_var_00,iVar5);
      }
      __position._M_current =
           (this->SolidNodeList).m_data.
           super__Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->SolidNodeList).m_data.
          super__Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
        ::_M_realloc_insert<irr::scene::CSceneManager::DefaultNodeEntry>
                  (&(this->SolidNodeList).m_data,__position,(DefaultNodeEntry *)&local_40);
      }
      else {
        (__position._M_current)->Node = local_40.Node;
        (__position._M_current)->TextureValue = (void *)local_40.Distance;
        ppDVar1 = &(this->SolidNodeList).m_data.
                   super__Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 1;
      }
      (this->SolidNodeList).is_sorted = false;
      return 1;
    }
    if (pass == ESNRP_TRANSPARENT_EFFECT) {
      iVar5 = (*(this->super_ISceneManager)._vptr_ISceneManager[0x23])(this,node);
      if ((char)iVar5 == '\0') {
        iVar5 = (*node->_vptr_ISceneNode[10])(node);
        lVar7 = CONCAT44(extraout_var_02,iVar5);
        fVar13 = *(float *)(lVar7 + 0x30) - (this->camWorldPos).X;
        fVar11 = *(float *)(lVar7 + 0x34) - (this->camWorldPos).Y;
        fVar12 = *(float *)(lVar7 + 0x38) - (this->camWorldPos).Z;
        local_40.Distance = (f64)(double)(fVar12 * fVar12 + fVar13 * fVar13 + fVar11 * fVar11);
        iVar8._M_current =
             (this->TransparentEffectNodeList).m_data.
             super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (this->TransparentEffectNodeList).m_data.
            super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
          ::_M_realloc_insert<irr::scene::CSceneManager::TransparentNodeEntry>
                    (&(this->TransparentEffectNodeList).m_data,iVar8,&local_40);
        }
        else {
          (iVar8._M_current)->Node = local_40.Node;
          (iVar8._M_current)->Distance = local_40.Distance;
          ppTVar2 = &(this->TransparentEffectNodeList).m_data.
                     super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppTVar2 = *ppTVar2 + 1;
        }
        (this->TransparentEffectNodeList).is_sorted = false;
        return 1;
      }
      return 0;
    }
    if (pass != ESNRP_GUI) {
      return 0;
    }
    iVar5 = (*(this->super_ISceneManager)._vptr_ISceneManager[0x23])(this,node);
    if ((char)iVar5 != '\0') {
      return 0;
    }
    this_00 = &this->GuiNodeList;
  }
  core::array<irr::scene::ISceneNode_*>::push_back(this_00,&local_30);
  return 1;
}

Assistant:

u32 CSceneManager::registerNodeForRendering(ISceneNode *node, E_SCENE_NODE_RENDER_PASS pass)
{
	u32 taken = 0;

	switch (pass) {
		// take camera if it is not already registered
	case ESNRP_CAMERA: {
		taken = 1;
		for (u32 i = 0; i != CameraList.size(); ++i) {
			if (CameraList[i] == node) {
				taken = 0;
				break;
			}
		}
		if (taken) {
			CameraList.push_back(node);
		}
	} break;
	case ESNRP_SKY_BOX:
		SkyBoxList.push_back(node);
		taken = 1;
		break;
	case ESNRP_SOLID:
		if (!isCulled(node)) {
			SolidNodeList.push_back(node);
			taken = 1;
		}
		break;
	case ESNRP_TRANSPARENT:
		if (!isCulled(node)) {
			TransparentNodeList.push_back(TransparentNodeEntry(node, camWorldPos));
			taken = 1;
		}
		break;
	case ESNRP_TRANSPARENT_EFFECT:
		if (!isCulled(node)) {
			TransparentEffectNodeList.push_back(TransparentNodeEntry(node, camWorldPos));
			taken = 1;
		}
		break;
	case ESNRP_AUTOMATIC:
		if (!isCulled(node)) {
			const u32 count = node->getMaterialCount();

			taken = 0;
			for (u32 i = 0; i < count; ++i) {
				if (Driver->needsTransparentRenderPass(node->getMaterial(i))) {
					// register as transparent node
					TransparentNodeEntry e(node, camWorldPos);
					TransparentNodeList.push_back(e);
					taken = 1;
					break;
				}
			}

			// not transparent, register as solid
			if (!taken) {
				SolidNodeList.push_back(node);
				taken = 1;
			}
		}
		break;
	case ESNRP_GUI:
		if (!isCulled(node)) {
			GuiNodeList.push_back(node);
			taken = 1;
		}

	// as of yet unused
	case ESNRP_LIGHT:
	case ESNRP_SHADOW:
	case ESNRP_NONE: // ignore this one
		break;
	}

	return taken;
}